

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

bool tinygltf::ParseJsonAsValue(Value *ret,json *o)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  char cVar3;
  bool bVar4;
  key_type *__args;
  reference pbVar5;
  size_t *psVar6;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  Value entry;
  long ret_1;
  const_iterator it;
  Value val;
  Value local_1b8;
  Value *local_120;
  undefined1 local_118 [8];
  iterator local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Base_ptr local_f8;
  size_t local_f0;
  const_iterator local_e8;
  Value local_c8;
  
  local_c8.string_value_._M_dataplus._M_p = (pointer)&local_c8.string_value_.field_2;
  local_c8.type_ = 0;
  local_c8.int_value_ = 0;
  local_c8.real_value_ = 0.0;
  local_c8.string_value_._M_string_length = 0;
  local_c8.string_value_.field_2._M_local_buf[0] = '\0';
  local_c8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.object_value_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8.boolean_value_ = false;
  local_c8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  switch(o->m_type) {
  case object:
    local_108._8_8_ = &local_110;
    local_110._M_node = local_110._M_node & 0xffffffff00000000;
    local_108._M_allocated_capacity = 0;
    local_f0 = 0;
    local_120 = ret;
    local_f8 = (_Base_ptr)local_108._8_8_;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::cbegin(&local_e8,o);
    paVar8 = &local_1b8.string_value_.field_2;
    p_Var2 = &local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header;
    while( true ) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::cend((const_iterator *)&local_1b8,o);
      bVar4 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==(&local_e8,
                           (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&local_1b8);
      ret = local_120;
      if (bVar4) break;
      local_1b8.type_ = 0;
      local_1b8.int_value_ = 0;
      local_1b8.real_value_ = 0.0;
      local_1b8.string_value_._M_string_length = 0;
      local_1b8.string_value_.field_2._M_allocated_capacity =
           (ulong)(uint7)local_1b8.string_value_.field_2._M_allocated_capacity._1_7_ << 8;
      local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1b8.boolean_value_ = false;
      local_1b8.string_value_._M_dataplus._M_p = (pointer)paVar8;
      local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var2->_M_header;
      local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var2->_M_header;
      pbVar5 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::operator*(&local_e8);
      ParseJsonAsValue(&local_1b8,pbVar5);
      if ((char)local_1b8.type_ != '\0') {
        __args = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::key(&local_e8);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinygltf::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,tinygltf::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinygltf::Value>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,tinygltf::Value>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinygltf::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,tinygltf::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinygltf::Value>>>
                    *)local_118,__args,&local_1b8);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
      ::~_Rb_tree(&local_1b8.object_value_._M_t);
      std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::~vector
                (&local_1b8.array_value_);
      if (local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b8.binary_value_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.string_value_._M_dataplus._M_p != paVar8) {
        operator_delete(local_1b8.string_value_._M_dataplus._M_p);
      }
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++(&local_e8);
    }
    if (local_f0 != 0) {
      local_1b8.type_ = 7;
      local_1b8.int_value_ = 0;
      local_1b8.real_value_ = 0.0;
      local_1b8.string_value_._M_string_length = 0;
      local_1b8.string_value_.field_2._M_allocated_capacity =
           (ulong)(uint7)local_1b8.string_value_.field_2._M_allocated_capacity._1_7_ << 8;
      local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((_Base_ptr)local_108._M_allocated_capacity == (_Base_ptr)0x0) {
        psVar6 = &local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var2->_M_header;
        local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var2->_M_header;
      }
      else {
        psVar6 = &local_f0;
        local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             (_Rb_tree_color)local_110._M_node;
        local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)local_108._M_allocated_capacity;
        local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)local_108._8_8_;
        local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_f8;
        *(_Rb_tree_header **)(local_108._M_allocated_capacity + 8) = p_Var2;
        local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_node_count = local_f0;
        local_108._M_allocated_capacity = 0;
        local_108._8_8_ = &local_110;
        local_f8 = (_Base_ptr)local_108._8_8_;
      }
      *psVar6 = 0;
      local_1b8.boolean_value_ = false;
      local_1b8.string_value_._M_dataplus._M_p = (pointer)paVar8;
      Value::operator=(&local_c8,&local_1b8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
      ::~_Rb_tree(&local_1b8.object_value_._M_t);
      std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::~vector
                (&local_1b8.array_value_);
      if (local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b8.binary_value_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.string_value_._M_dataplus._M_p != paVar8) {
        operator_delete(local_1b8.string_value_._M_dataplus._M_p);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                 *)local_118);
    goto switchD_00296f60_default;
  case array:
    local_e8.m_object = (pointer)0x0;
    local_e8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_e8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)0x0;
    local_120 = ret;
    std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::reserve
              ((vector<tinygltf::Value,_std::allocator<tinygltf::Value>_> *)&local_e8,
               (long)(((o->m_value).array)->
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(((o->m_value).array)->
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::cbegin((const_iterator *)local_118,o);
    paVar8 = &local_1b8.string_value_.field_2;
    p_Var2 = &local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header;
    while( true ) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::cend((const_iterator *)&local_1b8,o);
      bVar4 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==((const_iterator *)local_118,
                           (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&local_1b8);
      ret = local_120;
      if (bVar4) break;
      local_1b8.type_ = 0;
      local_1b8.int_value_ = 0;
      local_1b8.real_value_ = 0.0;
      local_1b8.string_value_._M_string_length = 0;
      local_1b8.string_value_.field_2._M_allocated_capacity =
           (ulong)(uint7)local_1b8.string_value_.field_2._M_allocated_capacity._1_7_ << 8;
      local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1b8.boolean_value_ = false;
      local_1b8.string_value_._M_dataplus._M_p = (pointer)paVar8;
      local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var2->_M_header;
      local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var2->_M_header;
      pbVar5 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::operator*((const_iterator *)local_118);
      ParseJsonAsValue(&local_1b8,pbVar5);
      if ((char)local_1b8.type_ != '\0') {
        std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::
        emplace_back<tinygltf::Value>
                  ((vector<tinygltf::Value,_std::allocator<tinygltf::Value>_> *)&local_e8,&local_1b8
                  );
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
      ::~_Rb_tree(&local_1b8.object_value_._M_t);
      std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::~vector
                (&local_1b8.array_value_);
      if (local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b8.binary_value_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.string_value_._M_dataplus._M_p != paVar8) {
        operator_delete(local_1b8.string_value_._M_dataplus._M_p);
      }
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++((const_iterator *)local_118);
    }
    if (local_e8.m_it.object_iterator._M_node != (_Base_ptr)local_e8.m_object) {
      local_1b8.type_ = 5;
      local_1b8.int_value_ = 0;
      local_1b8.real_value_ = 0.0;
      local_1b8.string_value_._M_string_length = 0;
      local_1b8.string_value_.field_2._M_allocated_capacity =
           (ulong)(uint7)local_1b8.string_value_.field_2._M_allocated_capacity._1_7_ << 8;
      local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_e8.m_object;
      local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_e8.m_it.object_iterator._M_node;
      local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_e8.m_it.array_iterator._M_current;
      local_e8.m_object = (pointer)0x0;
      local_e8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      local_e8.m_it.array_iterator._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)0x0;
      local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1b8.boolean_value_ = false;
      local_1b8.string_value_._M_dataplus._M_p = (pointer)paVar8;
      local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var2->_M_header;
      local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var2->_M_header;
      Value::operator=(&local_c8,&local_1b8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
      ::~_Rb_tree(&local_1b8.object_value_._M_t);
      std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::~vector
                (&local_1b8.array_value_);
      if (local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b8.binary_value_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.string_value_._M_dataplus._M_p != paVar8) {
        operator_delete(local_1b8.string_value_._M_dataplus._M_p);
      }
    }
    std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::~vector
              ((vector<tinygltf::Value,_std::allocator<tinygltf::Value>_> *)&local_e8);
    goto switchD_00296f60_default;
  case string:
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,o);
    paVar1 = &local_1b8.string_value_.field_2;
    local_1b8.type_ = 4;
    local_1b8.int_value_ = 0;
    local_1b8.real_value_ = 0.0;
    paVar8 = &local_108;
    if (local_118 == (undefined1  [8])paVar8) {
      local_1b8.string_value_.field_2._8_8_ = local_108._8_8_;
      local_1b8.string_value_._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1b8.string_value_._M_dataplus._M_p = (pointer)local_118;
    }
    local_1b8.string_value_.field_2._M_allocated_capacity = local_108._M_allocated_capacity;
    local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1b8.string_value_._M_string_length = (size_type)local_110._M_node;
    local_110._M_node = (_Base_ptr)0x0;
    local_108._M_allocated_capacity = local_108._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1b8.boolean_value_ = false;
    local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_118 = (undefined1  [8])paVar8;
    Value::operator=(&local_c8,&local_1b8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
    ::~_Rb_tree(&local_1b8.object_value_._M_t);
    std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::~vector(&local_1b8.array_value_)
    ;
    if (local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8.binary_value_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    _Var7._M_p = (pointer)local_118;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.string_value_._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8.string_value_._M_dataplus._M_p);
      _Var7._M_p = (pointer)local_118;
    }
    goto LAB_0029738d;
  case boolean:
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (o,(boolean_t *)local_118);
    local_1b8.type_ = 3;
    local_1b8.int_value_ = 0;
    local_1b8.real_value_ = 0.0;
    local_1b8.string_value_.field_2._M_allocated_capacity =
         local_1b8.string_value_.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8.boolean_value_ = (bool)local_118[0];
    break;
  case number_integer:
  case number_unsigned:
    nlohmann::detail::
    get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_long,_0>
              (o,(long *)local_118);
    local_1b8.string_value_.field_2._M_allocated_capacity =
         local_1b8.string_value_.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8.boolean_value_ = false;
    local_1b8.int_value_ = local_118._0_4_;
    local_1b8.type_ = 2;
    local_1b8.real_value_ = (double)(int)local_118._0_4_;
    break;
  case number_float:
    nlohmann::detail::
    get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
              (o,(double *)local_118);
    local_1b8.type_ = 1;
    local_1b8.int_value_ = 0;
    local_1b8.string_value_.field_2._M_allocated_capacity =
         local_1b8.string_value_.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8.boolean_value_ = false;
    local_1b8.real_value_ = (double)local_118;
    break;
  default:
    goto switchD_00296f60_default;
  }
  local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.string_value_._M_string_length = 0;
  paVar8 = &local_1b8.string_value_.field_2;
  local_1b8.string_value_._M_dataplus._M_p = (pointer)paVar8;
  local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1b8.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Value::operator=(&local_c8,&local_1b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::~_Rb_tree(&local_1b8.object_value_._M_t);
  std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::~vector(&local_1b8.array_value_);
  _Var7._M_p = local_1b8.string_value_._M_dataplus._M_p;
  if (local_1b8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.binary_value_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
    _Var7._M_p = local_1b8.string_value_._M_dataplus._M_p;
  }
LAB_0029738d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != paVar8) {
    operator_delete(_Var7._M_p);
  }
switchD_00296f60_default:
  if (ret != (Value *)0x0) {
    Value::operator=(ret,&local_c8);
  }
  cVar3 = (char)local_c8.type_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::~_Rb_tree(&local_c8.object_value_._M_t);
  std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::~vector(&local_c8.array_value_);
  if (local_c8.binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.binary_value_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.string_value_._M_dataplus._M_p != &local_c8.string_value_.field_2) {
    operator_delete(local_c8.string_value_._M_dataplus._M_p);
  }
  return cVar3 != '\0';
}

Assistant:

static bool ParseJsonAsValue(Value *ret, const json &o) {
  Value val{};
#ifdef TINYGLTF_USE_RAPIDJSON
  using rapidjson::Type;
  switch (o.GetType()) {
    case Type::kObjectType: {
      Value::Object value_object;
      for (auto it = o.MemberBegin(); it != o.MemberEnd(); ++it) {
        Value entry;
        ParseJsonAsValue(&entry, it->value);
        if (entry.Type() != NULL_TYPE)
          value_object.emplace(GetKey(it), std::move(entry));
      }
      if (value_object.size() > 0) val = Value(std::move(value_object));
    } break;
    case Type::kArrayType: {
      Value::Array value_array;
      value_array.reserve(o.Size());
      for (auto it = o.Begin(); it != o.End(); ++it) {
        Value entry;
        ParseJsonAsValue(&entry, *it);
        if (entry.Type() != NULL_TYPE)
          value_array.emplace_back(std::move(entry));
      }
      if (value_array.size() > 0) val = Value(std::move(value_array));
    } break;
    case Type::kStringType:
      val = Value(std::string(o.GetString()));
      break;
    case Type::kFalseType:
    case Type::kTrueType:
      val = Value(o.GetBool());
      break;
    case Type::kNumberType:
      if (!o.IsDouble()) {
        int i = 0;
        GetInt(o, i);
        val = Value(i);
      } else {
        double d = 0.0;
        GetDouble(o, d);
        val = Value(d);
      }
      break;
    case Type::kNullType:
    default:
      // default:
      break;
  }
#else
  switch (o.type()) {
    case json::value_t::object: {
      Value::Object value_object;
      for (auto it = o.begin(); it != o.end(); it++) {
        Value entry;
        ParseJsonAsValue(&entry, it.value());
        if (entry.Type() != NULL_TYPE)
          value_object.emplace(it.key(), std::move(entry));
      }
      if (value_object.size() > 0) val = Value(std::move(value_object));
    } break;
    case json::value_t::array: {
      Value::Array value_array;
      value_array.reserve(o.size());
      for (auto it = o.begin(); it != o.end(); it++) {
        Value entry;
        ParseJsonAsValue(&entry, it.value());
        if (entry.Type() != NULL_TYPE)
          value_array.emplace_back(std::move(entry));
      }
      if (value_array.size() > 0) val = Value(std::move(value_array));
    } break;
    case json::value_t::string:
      val = Value(o.get<std::string>());
      break;
    case json::value_t::boolean:
      val = Value(o.get<bool>());
      break;
    case json::value_t::number_integer:
    case json::value_t::number_unsigned:
      val = Value(static_cast<int>(o.get<int64_t>()));
      break;
    case json::value_t::number_float:
      val = Value(o.get<double>());
      break;
    case json::value_t::null:
    case json::value_t::discarded:
      // default:
      break;
  }
#endif
  if (ret) *ret = std::move(val);

  return val.Type() != NULL_TYPE;
}